

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::openImageFile(UEFITool *this)

{
  QString path;
  QString local_70;
  QArrayData *local_58;
  char16_t *local_50;
  qsizetype qStack_48;
  QArrayData *local_40 [3];
  QArrayData *local_28 [3];
  
  QMetaObject::tr((char *)local_28,(char *)&staticMetaObject,0x1d2dd7);
  QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x1d2dec);
  QFileDialog::getOpenFileName(&local_58,this,local_28,&this->currentDir,local_40,0,0);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  if (local_28[0] != (QArrayData *)0x0) {
    LOCK();
    (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28[0],2,8);
    }
  }
  local_70.d.d = (Data *)local_58;
  local_70.d.ptr = local_50;
  local_70.d.size = qStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  openImageFile(this,&local_70);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  return;
}

Assistant:

void UEFITool::openImageFile()
{
    QString path = QFileDialog::getOpenFileName(this, tr("Open BIOS image file"), currentDir, tr("BIOS image files (*.rom *.bin *.cap *scap *.bio *.fd *.wph *.dec);;All files (*)"));
    openImageFile(path);
}